

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O1

error<idx2::idx2_err_code>
idx2::TraverseHierarchy
          (u64 TraverseOrder,v3i *From3,v3i *Dims3,extent *Extent,extent *VolExtent,
          traverse_callback *Callback)

{
  anon_union_8_4_6ba14846_for_v2<int>_1 *paVar1;
  ulong *puVar2;
  byte *pbVar3;
  u64 uVar4;
  u64 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar8;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar9;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  uint3 uVar13;
  i64 iVar14;
  array<idx2::traverse_item> *paVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long *in_FS_OFFSET;
  bool bVar28;
  error<idx2::idx2_err_code> eVar29;
  extent eVar30;
  traverse_item First;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Common_cpp:820:3)>
  __ScopeGuard__820;
  traverse_item Second;
  extent Skip;
  anon_union_12_8_3dedac88_for_v3<int>_1 local_178;
  anon_union_12_8_3dedac88_for_v3<int>_1 aStack_16c;
  undefined5 uStack_160;
  uint3 uStack_15b;
  undefined5 local_158;
  uint3 uStack_153;
  undefined5 local_150;
  undefined3 uStack_14b;
  int local_148;
  uint local_144;
  int local_13c;
  array<idx2::traverse_item> local_138;
  ulong local_100;
  ulong local_f8;
  undefined8 uStack_f0;
  int iStack_e8;
  int iStack_e4;
  undefined5 uStack_e0;
  uint3 uStack_db;
  undefined5 uStack_d8;
  uint3 uStack_d3;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  int iStack_c8;
  uint uStack_c4;
  cstr local_c0;
  ulong local_b8;
  long local_b0;
  extent *local_a8;
  traverse_callback *local_a0;
  ulong local_98;
  ulong local_90;
  array<idx2::traverse_item> *local_88;
  undefined1 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  int iStack_68;
  int iStack_64;
  undefined5 uStack_60;
  uint3 uStack_5b;
  undefined5 uStack_58;
  uint3 uStack_53;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  int iStack_48;
  uint uStack_44;
  extent local_40;
  
  local_a8 = VolExtent;
  local_a0 = Callback;
  if (Mallocator()::Instance == '\0') {
    TraverseHierarchy();
  }
  if (Mallocator()::Instance == '\0') {
    TraverseHierarchy();
  }
  local_88 = &local_138;
  local_138.Buffer.Data = (byte *)0x0;
  local_138.Buffer.Bytes = 0;
  local_138.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
  local_138.Size = 0;
  local_138.Capacity = 0;
  local_138.Alloc = (allocator *)&Mallocator()::Instance;
  local_80 = 0;
  GrowCapacity<idx2::traverse_item>(local_88,0x40);
  lVar22 = (long)(Dims3->field_0).field_0.X;
  iVar16 = 1;
  iVar21 = 1;
  if (lVar22 != 0) {
    uVar23 = lVar22 - 1;
    lVar22 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    iVar21 = 1;
    if (uVar23 != 0) {
      iVar21 = (int)(1L << (-((byte)lVar22 ^ 0x3f) & 0x3f));
    }
  }
  lVar22 = (long)(Dims3->field_0).field_0.Y;
  if (lVar22 != 0) {
    uVar23 = lVar22 - 1;
    lVar22 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    iVar16 = 1;
    if (uVar23 != 0) {
      iVar16 = (int)(1L << (-((byte)lVar22 ^ 0x3f) & 0x3f));
    }
  }
  lVar22 = (long)(Dims3->field_0).field_0.Z;
  if (lVar22 == 0) {
    iVar19 = 1;
  }
  else {
    uVar23 = lVar22 - 1;
    lVar22 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    iVar19 = 1;
    if (uVar23 != 0) {
      iVar19 = (int)(1L << (-((byte)lVar22 ^ 0x3f) & 0x3f));
    }
  }
  local_150 = 0;
  uStack_14b = 0;
  local_148 = 0;
  local_144 = local_144 & 0xffffff00;
  local_178.field_3.XY.field_0 = (v2<int>)(From3->field_0).field_3.XY.field_0;
  local_178.field_0.Z = (From3->field_0).field_0.Z;
  aStack_16c.field_0.X = iVar21 + (From3->field_0).field_0.X;
  aStack_16c.field_0.Y = iVar16 + (From3->field_0).field_0.Y;
  aStack_16c.field_0.Z = iVar19 + (From3->field_0).field_0.Z;
  local_158 = (undefined5)TraverseOrder;
  uStack_153 = (uint3)(TraverseOrder >> 0x28);
  uStack_160 = local_158;
  uStack_15b = uStack_153;
  if (local_138.Capacity <= local_138.Size) {
    GrowCapacity<idx2::traverse_item>(&local_138,0);
  }
  iVar14 = local_138.Size;
  local_138.Size = local_138.Size + 1;
  aVar8.field_0.Y = aStack_16c.field_0.X;
  aVar8.field_0.X = local_178.field_0.Z;
  aVar9.field_0.Y = aStack_16c.field_0.Z;
  aVar9.field_0.X = aStack_16c.field_0.Y;
  aVar10.field_0.Y._1_3_ = uStack_15b;
  aVar10._0_5_ = uStack_160;
  pbVar3 = local_138.Buffer.Data + iVar14 * 0x38 + 0x15;
  *(ulong *)pbVar3 = CONCAT53(uStack_160,aStack_16c.field_0.Z._1_3_);
  *(ulong *)(pbVar3 + 8) = CONCAT53(local_158,uStack_15b);
  *(ulong *)(pbVar3 + 0x10) = CONCAT53(local_150,uStack_153);
  *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)local_144,CONCAT43(local_148,uStack_14b));
  paVar1 = (anon_union_8_4_6ba14846_for_v2<int>_1 *)(local_138.Buffer.Data + iVar14 * 0x38);
  paVar1->field_0 =
       (anon_struct_8_2_94730de6_for_anon_union_8_4_6ba14846_for_v2<int>_1_0)
       local_178.field_3.XY.field_0;
  paVar1[1] = aVar8;
  paVar1[2] = aVar9;
  paVar1[3] = aVar10;
  local_b0 = *in_FS_OFFSET + -0x980;
  local_b8 = *in_FS_OFFSET - 0xb80U;
  local_100 = *in_FS_OFFSET - 0xb80U;
  do {
    lVar22 = (local_138.Size + -1) * 0x38;
    puVar2 = (ulong *)(local_138.Buffer.Data + lVar22);
    uVar23 = *puVar2;
    uVar17 = puVar2[1];
    pbVar3 = local_138.Buffer.Data + lVar22 + 0x15;
    uVar6 = *(undefined8 *)pbVar3;
    uVar7 = *(undefined8 *)(pbVar3 + 0x18);
    local_178._0_8_ = uVar23;
    uVar11 = local_178._0_8_;
    local_178.field_0.Z = (int)uVar17;
    uVar12 = local_178.field_0.Z;
    aStack_16c.field_0.X = (int)(uVar17 >> 0x20);
    aStack_16c.field_0.Y = (int)puVar2[2];
    aStack_16c.field_0.Z._0_1_ = (undefined1)(puVar2[2] >> 0x20);
    aStack_16c.field_0.Z._1_3_ = (undefined3)uVar6;
    uStack_160 = (undefined5)((ulong)uVar6 >> 0x18);
    uStack_15b = (uint3)*(undefined8 *)(pbVar3 + 8);
    uVar13 = uStack_15b;
    local_158 = (undefined5)((ulong)*(undefined8 *)(pbVar3 + 8) >> 0x18);
    uStack_153 = (uint3)*(undefined8 *)(pbVar3 + 0x10);
    local_150 = (undefined5)((ulong)*(undefined8 *)(pbVar3 + 0x10) >> 0x18);
    uStack_14b = (undefined3)uVar7;
    local_148 = (int)((ulong)uVar7 >> 0x18);
    local_144._0_1_ = (undefined1)((ulong)uVar7 >> 0x38);
    uVar24 = CONCAT35(uStack_15b,uStack_160) >> 2;
    uStack_160 = (undefined5)uVar24;
    uStack_15b = uStack_15b >> 2;
    uVar20 = (uint)((ulong)uVar6 >> 0x18);
    if ((~uVar20 & 3) == 0) {
      if (uVar24 != 3) {
        uStack_153 = uVar13 >> 2;
        local_158 = uStack_160;
      }
      bVar28 = false;
      uStack_160 = local_158;
      uStack_15b = uStack_153;
    }
    else {
      if (local_138.Size != 0) {
        local_138.Size = local_138.Size + -1;
      }
      local_178.field_0.X = (int)uVar23;
      local_178.field_0.Y = (int)(uVar23 >> 0x20);
      local_178._0_8_ = uVar11;
      if (((aStack_16c.field_0.X - local_178._0_4_ == 1) &&
          (aStack_16c.field_0.Y - local_178._4_4_ == 1)) &&
         (aStack_16c.field_0.Z - local_178._8_4_ == 1)) {
        local_144 = CONCAT31(local_144._1_3_,local_138.Size == 0);
        eVar29 = (*local_a0)((traverse_item *)&local_178.field_0);
        if (eVar29.Code != NoError) {
          if ('?' < eVar29.StackIdx) {
            __assert_fail("false && \"stack too deep\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x35d,
                          "auto idx2::TraverseHierarchy(u64, const v3i &, const v3i &, const extent &, const extent &, traverse_callback *)::(anonymous class)::operator()() const"
                         );
          }
          bVar18 = eVar29.StackIdx + 1;
          local_100 = (ulong)(eVar29._8_4_ & 0xff00ff | (uint)bVar18 << 8);
          *(undefined4 *)(local_b0 + (long)(char)bVar18 * 4) = 0x35d;
          *(char **)(local_b8 + (long)(char)bVar18 * 8) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
          ;
          local_c0 = eVar29.Msg;
        }
        bVar28 = eVar29.Code != NoError;
      }
      else {
        uStack_d8 = local_158;
        uStack_d3 = uStack_153;
        uStack_d0 = local_150;
        uStack_cb = uStack_14b;
        iStack_c8 = local_148;
        uStack_c4 = local_144;
        local_f8 = uVar23;
        uStack_f0 = uVar17;
        iStack_e8 = aStack_16c.field_0.Y;
        iStack_e4 = aStack_16c.field_0.Z;
        uStack_e0 = uStack_160;
        uStack_db = uStack_15b;
        uStack_58 = local_158;
        uStack_53 = uStack_153;
        uStack_50 = local_150;
        uStack_4b = uStack_14b;
        iStack_48 = local_148;
        uStack_44 = local_144;
        local_78 = uVar23;
        uStack_70 = uVar17;
        iStack_68 = aStack_16c.field_0.Y;
        iStack_64 = aStack_16c.field_0.Z;
        uStack_60 = uStack_160;
        uStack_5b = uStack_15b;
        uVar17 = (ulong)((uVar20 & 3) << 2);
        iVar21 = (*(int *)((long)&aStack_16c + uVar17) - *(int *)((long)&local_178 + uVar17)) / 2 +
                 *(int *)((long)&local_178 + uVar17);
        *(int *)((long)&uStack_f0 + uVar17 + 4) = iVar21;
        iVar16 = iStack_c8;
        *(int *)((long)&local_78 + uVar17) = iVar21;
        local_98 = uVar23 & 0xffffffff;
        local_90 = (ulong)(uint)local_178.field_0.Y;
        local_13c = aStack_16c.field_0.X;
        uVar20 = aStack_16c.field_0.X - local_178._0_4_;
        lVar27 = (long)iStack_e8;
        lVar22 = (long)local_178.field_0.Y;
        lVar26 = (long)iStack_e4;
        lVar25 = (long)local_178.field_0.Z;
        local_40.From =
             (ulong)(local_178.field_0.Z & 0x1fffff) << 0x2a |
             (local_90 & 0x1fffff) << 0x15 | uVar23 & 0x1fffff;
        local_40.Dims =
             (ulong)((uint)(lVar26 - lVar25) & 0x1fffff) << 0x2a |
             (ulong)((uint)(lVar27 - lVar22) & 0x1fffff) << 0x15 | (ulong)(uVar20 & 0x1fffff);
        eVar30 = Crop<idx2::extent,idx2::extent>(&local_40,local_a8);
        iStack_48 = (((int)eVar30.Dims << 0xb) >> 0xb) * (int)((long)(eVar30.Dims * 2) >> 0x2b) *
                    (int)((long)(eVar30.Dims << 0x16) >> 0x2b) + iVar16;
        uStack_d0 = local_150;
        uStack_cb = uStack_14b;
        lVar22 = (lVar27 - lVar22) * (long)(int)uVar20 * (lVar26 - lVar25) +
                 CONCAT35(uStack_14b,local_150);
        uStack_50 = (undefined5)lVar22;
        uStack_4b = (undefined3)((ulong)lVar22 >> 0x28);
        uVar4 = Extent->From;
        uVar5 = Extent->Dims;
        iVar16 = (int)((long)(uVar4 << 0x2b) >> 0x2b);
        if ((int)local_78 < (((int)uVar5 << 0xb) >> 0xb) + iVar16) {
          if (local_78._4_4_ <
              (int)(((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) +
                    ((long)(uVar5 << 0x16) >> 0xb) >> 0x20)) {
            iVar21 = (int)((long)(uVar4 * 2) >> 0x2b);
            if ((((int)uStack_70 < (int)((long)(uVar5 * 2) >> 0x2b) + iVar21) &&
                (iVar16 < uStack_70._4_4_)) &&
               (((int)((long)(uVar4 << 0x16) >> 0x2b) < iStack_68 && (iVar21 < iStack_64)))) {
              if (local_138.Capacity <= local_138.Size) {
                GrowCapacity<idx2::traverse_item>(&local_138,0);
              }
              iVar14 = local_138.Size;
              local_138.Size = local_138.Size + 1;
              pbVar3 = local_138.Buffer.Data + iVar14 * 0x38 + 0x15;
              *(ulong *)pbVar3 = CONCAT53(uStack_60,iStack_64._1_3_);
              *(ulong *)(pbVar3 + 8) = CONCAT53(uStack_58,uStack_5b);
              *(ulong *)(pbVar3 + 0x10) = CONCAT53(uStack_50,uStack_53);
              *(ulong *)(pbVar3 + 0x18) =
                   CONCAT17((undefined1)uStack_44,CONCAT43(iStack_48,uStack_4b));
              puVar2 = (ulong *)(local_138.Buffer.Data + iVar14 * 0x38);
              *puVar2 = local_78;
              puVar2[1] = uStack_70;
              puVar2[2] = CONCAT44(iStack_64,iStack_68);
              puVar2[3] = CONCAT35(uStack_5b,uStack_60);
            }
          }
        }
        uVar4 = Extent->From;
        uVar5 = Extent->Dims;
        iVar21 = ((int)uVar4 << 0xb) >> 0xb;
        iVar16 = (int)((long)(uVar4 * 2) >> 0x2b);
        if ((((iVar21 < local_13c &&
              ((int)uVar12 < (int)((long)(uVar5 * 2) >> 0x2b) + iVar16 &&
              (int)local_98 < (((int)uVar5 << 0xb) >> 0xb) + iVar21)) &&
              (int)local_90 <
              (int)(((long)(uVar4 << 0x16) >> 0xb & 0xffffffff00000000U) +
                    ((long)(uVar5 << 0x16) >> 0xb) >> 0x20)) &&
            ((int)((long)(uVar4 << 0x16) >> 0x2b) < iStack_e8)) && (iVar16 < iStack_e4)) {
          if (local_138.Capacity <= local_138.Size) {
            GrowCapacity<idx2::traverse_item>(&local_138,0);
          }
          iVar14 = local_138.Size;
          local_138.Size = local_138.Size + 1;
          pbVar3 = local_138.Buffer.Data + iVar14 * 0x38 + 0x15;
          *(ulong *)pbVar3 = CONCAT53(uStack_e0,iStack_e4._1_3_);
          *(ulong *)(pbVar3 + 8) = CONCAT53(uStack_d8,uStack_db);
          *(ulong *)(pbVar3 + 0x10) = CONCAT53(uStack_d0,uStack_d3);
          *(ulong *)(pbVar3 + 0x18) = CONCAT17((undefined1)uStack_c4,CONCAT43(iStack_c8,uStack_cb));
          puVar2 = (ulong *)(local_138.Buffer.Data + iVar14 * 0x38);
          *puVar2 = local_f8;
          puVar2[1] = uStack_f0;
          puVar2[2] = CONCAT44(iStack_e4,iStack_e8);
          puVar2[3] = CONCAT35(uStack_db,uStack_e0);
        }
        bVar28 = false;
      }
    }
    paVar15 = local_88;
  } while (!bVar28);
  (*local_88->Alloc->_vptr_allocator[1])(local_88->Alloc,local_88);
  paVar15->Size = 0;
  paVar15->Capacity = 0;
  eVar29._8_4_ = (uint)local_100 & 0xffffff;
  eVar29.Msg = local_c0;
  eVar29._12_4_ = 0;
  return eVar29;
}

Assistant:

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}